

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O0

void __thiscall ObjLoader::loadBinaryFile(ObjLoader *this,string *filename)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  reference v;
  reference pSVar4;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar5;
  size_t __nbytes;
  size_t __nbytes_00;
  size_t __nbytes_01;
  size_t __nbytes_02;
  size_t __nbytes_03;
  size_t __nbytes_04;
  size_t __nbytes_05;
  size_t extraout_RDX;
  size_t __nbytes_06;
  size_t __nbytes_07;
  size_t extraout_RDX_00;
  size_t __nbytes_08;
  size_t __nbytes_09;
  size_t __nbytes_10;
  size_t __nbytes_11;
  size_t __nbytes_12;
  SimpleMaterial *material;
  iterator __end1_1;
  iterator __begin1_1;
  vector<SimpleMaterial,_std::allocator<SimpleMaterial>_> *__range1_1;
  size_t dataSize;
  undefined1 local_3b8 [4];
  int32 value;
  Image<unsigned_char> image;
  string name;
  IBO *ibo;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  uint64_t count;
  string magic;
  char acStack_328 [8];
  char magicBuffer [255];
  istream local_220 [8];
  ifstream file;
  string *filename_local;
  ObjLoader *this_local;
  
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (filename);
  std::ifstream::ifstream(local_220,pcVar3,8);
  magicBuffer[0xe8] = '\0';
  magicBuffer[0xe9] = '\0';
  magicBuffer[0xea] = '\0';
  magicBuffer[0xeb] = '\0';
  magicBuffer[0xec] = '\0';
  magicBuffer[0xed] = '\0';
  magicBuffer[0xee] = '\0';
  magicBuffer[0xef] = '\0';
  magicBuffer[0xf0] = '\0';
  magicBuffer[0xf1] = '\0';
  magicBuffer[0xf2] = '\0';
  magicBuffer[0xf3] = '\0';
  magicBuffer[0xf4] = '\0';
  magicBuffer[0xf5] = '\0';
  magicBuffer[0xf6] = '\0';
  magicBuffer[0xd8] = '\0';
  magicBuffer[0xd9] = '\0';
  magicBuffer[0xda] = '\0';
  magicBuffer[0xdb] = '\0';
  magicBuffer[0xdc] = '\0';
  magicBuffer[0xdd] = '\0';
  magicBuffer[0xde] = '\0';
  magicBuffer[0xdf] = '\0';
  magicBuffer[0xe0] = '\0';
  magicBuffer[0xe1] = '\0';
  magicBuffer[0xe2] = '\0';
  magicBuffer[0xe3] = '\0';
  magicBuffer[0xe4] = '\0';
  magicBuffer[0xe5] = '\0';
  magicBuffer[0xe6] = '\0';
  magicBuffer[0xe7] = '\0';
  magicBuffer[200] = '\0';
  magicBuffer[0xc9] = '\0';
  magicBuffer[0xca] = '\0';
  magicBuffer[0xcb] = '\0';
  magicBuffer[0xcc] = '\0';
  magicBuffer[0xcd] = '\0';
  magicBuffer[0xce] = '\0';
  magicBuffer[0xcf] = '\0';
  magicBuffer[0xd0] = '\0';
  magicBuffer[0xd1] = '\0';
  magicBuffer[0xd2] = '\0';
  magicBuffer[0xd3] = '\0';
  magicBuffer[0xd4] = '\0';
  magicBuffer[0xd5] = '\0';
  magicBuffer[0xd6] = '\0';
  magicBuffer[0xd7] = '\0';
  magicBuffer[0xb8] = '\0';
  magicBuffer[0xb9] = '\0';
  magicBuffer[0xba] = '\0';
  magicBuffer[0xbb] = '\0';
  magicBuffer[0xbc] = '\0';
  magicBuffer[0xbd] = '\0';
  magicBuffer[0xbe] = '\0';
  magicBuffer[0xbf] = '\0';
  magicBuffer[0xc0] = '\0';
  magicBuffer[0xc1] = '\0';
  magicBuffer[0xc2] = '\0';
  magicBuffer[0xc3] = '\0';
  magicBuffer[0xc4] = '\0';
  magicBuffer[0xc5] = '\0';
  magicBuffer[0xc6] = '\0';
  magicBuffer[199] = '\0';
  magicBuffer[0xa8] = '\0';
  magicBuffer[0xa9] = '\0';
  magicBuffer[0xaa] = '\0';
  magicBuffer[0xab] = '\0';
  magicBuffer[0xac] = '\0';
  magicBuffer[0xad] = '\0';
  magicBuffer[0xae] = '\0';
  magicBuffer[0xaf] = '\0';
  magicBuffer[0xb0] = '\0';
  magicBuffer[0xb1] = '\0';
  magicBuffer[0xb2] = '\0';
  magicBuffer[0xb3] = '\0';
  magicBuffer[0xb4] = '\0';
  magicBuffer[0xb5] = '\0';
  magicBuffer[0xb6] = '\0';
  magicBuffer[0xb7] = '\0';
  magicBuffer[0x98] = '\0';
  magicBuffer[0x99] = '\0';
  magicBuffer[0x9a] = '\0';
  magicBuffer[0x9b] = '\0';
  magicBuffer[0x9c] = '\0';
  magicBuffer[0x9d] = '\0';
  magicBuffer[0x9e] = '\0';
  magicBuffer[0x9f] = '\0';
  magicBuffer[0xa0] = '\0';
  magicBuffer[0xa1] = '\0';
  magicBuffer[0xa2] = '\0';
  magicBuffer[0xa3] = '\0';
  magicBuffer[0xa4] = '\0';
  magicBuffer[0xa5] = '\0';
  magicBuffer[0xa6] = '\0';
  magicBuffer[0xa7] = '\0';
  magicBuffer[0x88] = '\0';
  magicBuffer[0x89] = '\0';
  magicBuffer[0x8a] = '\0';
  magicBuffer[0x8b] = '\0';
  magicBuffer[0x8c] = '\0';
  magicBuffer[0x8d] = '\0';
  magicBuffer[0x8e] = '\0';
  magicBuffer[0x8f] = '\0';
  magicBuffer[0x90] = '\0';
  magicBuffer[0x91] = '\0';
  magicBuffer[0x92] = '\0';
  magicBuffer[0x93] = '\0';
  magicBuffer[0x94] = '\0';
  magicBuffer[0x95] = '\0';
  magicBuffer[0x96] = '\0';
  magicBuffer[0x97] = '\0';
  magicBuffer[0x78] = '\0';
  magicBuffer[0x79] = '\0';
  magicBuffer[0x7a] = '\0';
  magicBuffer[0x7b] = '\0';
  magicBuffer[0x7c] = '\0';
  magicBuffer[0x7d] = '\0';
  magicBuffer[0x7e] = '\0';
  magicBuffer[0x7f] = '\0';
  magicBuffer[0x80] = '\0';
  magicBuffer[0x81] = '\0';
  magicBuffer[0x82] = '\0';
  magicBuffer[0x83] = '\0';
  magicBuffer[0x84] = '\0';
  magicBuffer[0x85] = '\0';
  magicBuffer[0x86] = '\0';
  magicBuffer[0x87] = '\0';
  magicBuffer[0x68] = '\0';
  magicBuffer[0x69] = '\0';
  magicBuffer[0x6a] = '\0';
  magicBuffer[0x6b] = '\0';
  magicBuffer[0x6c] = '\0';
  magicBuffer[0x6d] = '\0';
  magicBuffer[0x6e] = '\0';
  magicBuffer[0x6f] = '\0';
  magicBuffer[0x70] = '\0';
  magicBuffer[0x71] = '\0';
  magicBuffer[0x72] = '\0';
  magicBuffer[0x73] = '\0';
  magicBuffer[0x74] = '\0';
  magicBuffer[0x75] = '\0';
  magicBuffer[0x76] = '\0';
  magicBuffer[0x77] = '\0';
  magicBuffer[0x58] = '\0';
  magicBuffer[0x59] = '\0';
  magicBuffer[0x5a] = '\0';
  magicBuffer[0x5b] = '\0';
  magicBuffer[0x5c] = '\0';
  magicBuffer[0x5d] = '\0';
  magicBuffer[0x5e] = '\0';
  magicBuffer[0x5f] = '\0';
  magicBuffer[0x60] = '\0';
  magicBuffer[0x61] = '\0';
  magicBuffer[0x62] = '\0';
  magicBuffer[99] = '\0';
  magicBuffer[100] = '\0';
  magicBuffer[0x65] = '\0';
  magicBuffer[0x66] = '\0';
  magicBuffer[0x67] = '\0';
  magicBuffer[0x48] = '\0';
  magicBuffer[0x49] = '\0';
  magicBuffer[0x4a] = '\0';
  magicBuffer[0x4b] = '\0';
  magicBuffer[0x4c] = '\0';
  magicBuffer[0x4d] = '\0';
  magicBuffer[0x4e] = '\0';
  magicBuffer[0x4f] = '\0';
  magicBuffer[0x50] = '\0';
  magicBuffer[0x51] = '\0';
  magicBuffer[0x52] = '\0';
  magicBuffer[0x53] = '\0';
  magicBuffer[0x54] = '\0';
  magicBuffer[0x55] = '\0';
  magicBuffer[0x56] = '\0';
  magicBuffer[0x57] = '\0';
  magicBuffer[0x38] = '\0';
  magicBuffer[0x39] = '\0';
  magicBuffer[0x3a] = '\0';
  magicBuffer[0x3b] = '\0';
  magicBuffer[0x3c] = '\0';
  magicBuffer[0x3d] = '\0';
  magicBuffer[0x3e] = '\0';
  magicBuffer[0x3f] = '\0';
  magicBuffer[0x40] = '\0';
  magicBuffer[0x41] = '\0';
  magicBuffer[0x42] = '\0';
  magicBuffer[0x43] = '\0';
  magicBuffer[0x44] = '\0';
  magicBuffer[0x45] = '\0';
  magicBuffer[0x46] = '\0';
  magicBuffer[0x47] = '\0';
  magicBuffer[0x28] = '\0';
  magicBuffer[0x29] = '\0';
  magicBuffer[0x2a] = '\0';
  magicBuffer[0x2b] = '\0';
  magicBuffer[0x2c] = '\0';
  magicBuffer[0x2d] = '\0';
  magicBuffer[0x2e] = '\0';
  magicBuffer[0x2f] = '\0';
  magicBuffer[0x30] = '\0';
  magicBuffer[0x31] = '\0';
  magicBuffer[0x32] = '\0';
  magicBuffer[0x33] = '\0';
  magicBuffer[0x34] = '\0';
  magicBuffer[0x35] = '\0';
  magicBuffer[0x36] = '\0';
  magicBuffer[0x37] = '\0';
  magicBuffer[0x18] = '\0';
  magicBuffer[0x19] = '\0';
  magicBuffer[0x1a] = '\0';
  magicBuffer[0x1b] = '\0';
  magicBuffer[0x1c] = '\0';
  magicBuffer[0x1d] = '\0';
  magicBuffer[0x1e] = '\0';
  magicBuffer[0x1f] = '\0';
  magicBuffer[0x20] = '\0';
  magicBuffer[0x21] = '\0';
  magicBuffer[0x22] = '\0';
  magicBuffer[0x23] = '\0';
  magicBuffer[0x24] = '\0';
  magicBuffer[0x25] = '\0';
  magicBuffer[0x26] = '\0';
  magicBuffer[0x27] = '\0';
  magicBuffer[8] = '\0';
  magicBuffer[9] = '\0';
  magicBuffer[10] = '\0';
  magicBuffer[0xb] = '\0';
  magicBuffer[0xc] = '\0';
  magicBuffer[0xd] = '\0';
  magicBuffer[0xe] = '\0';
  magicBuffer[0xf] = '\0';
  magicBuffer[0x10] = '\0';
  magicBuffer[0x11] = '\0';
  magicBuffer[0x12] = '\0';
  magicBuffer[0x13] = '\0';
  magicBuffer[0x14] = '\0';
  magicBuffer[0x15] = '\0';
  magicBuffer[0x16] = '\0';
  magicBuffer[0x17] = '\0';
  acStack_328[0] = '\0';
  acStack_328[1] = '\0';
  acStack_328[2] = '\0';
  acStack_328[3] = '\0';
  acStack_328[4] = '\0';
  acStack_328[5] = '\0';
  acStack_328[6] = '\0';
  acStack_328[7] = '\0';
  magicBuffer[0] = '\0';
  magicBuffer[1] = '\0';
  magicBuffer[2] = '\0';
  magicBuffer[3] = '\0';
  magicBuffer[4] = '\0';
  magicBuffer[5] = '\0';
  magicBuffer[6] = '\0';
  magicBuffer[7] = '\0';
  std::istream::read((char *)local_220,(long)acStack_328);
  iVar2 = strcmp(acStack_328,"GLITTER_BIN_OBJ\n");
  if (iVar2 != 0) {
    __assert_fail("!strcmp(magicBuffer, GLITTER_BINFILE_MAGIC) && \"ObjLoader::loadBinaryFile(): Wrong file magic number\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x110,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  std::__cxx11::string::string((string *)&count);
  read((int)(string *)&count,local_220,__nbytes);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &count,"[VertexPositions]");
  if (!bVar1) {
    __assert_fail("(magic == \"[VertexPositions]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x115,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<3,float,(glm::qualifier)0>>(&this->m_vertexPositions,local_220);
  read((int)&count,local_220,__nbytes_00);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &count,"[VertexColors]");
  if (!bVar1) {
    __assert_fail("(magic == \"[VertexColors]\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x119,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<4,float,(glm::qualifier)0>>(&this->m_vertexColors,local_220);
  read((int)&count,local_220,__nbytes_01);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &count,"[VertexUVs]");
  if (!bVar1) {
    __assert_fail("(magic == \"[VertexUVs]\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x11d,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<2,float,(glm::qualifier)0>>(&this->m_vertexUVs,local_220);
  read((int)&count,local_220,__nbytes_02);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &count,"[VertexNormals]");
  if (!bVar1) {
    __assert_fail("(magic == \"[VertexNormals]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x121,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<3,float,(glm::qualifier)0>>(&this->m_vertexNormals,local_220);
  read((int)&count,local_220,__nbytes_03);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &count,"[VertexTangents]");
  if (!bVar1) {
    __assert_fail("(magic == \"[VertexTangents]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x125,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<3,float,(glm::qualifier)0>>(&this->m_vertexTangents,local_220);
  read((int)&count,local_220,__nbytes_04);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &count,"[IBOS]");
  if (!bVar1) {
    __assert_fail("(magic == \"[IBOS]\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x129,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<unsigned_long>((unsigned_long *)&__range1,local_220);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->m_ibos,(size_type)__range1);
  __end1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin(&this->m_ibos);
  ibo = (IBO *)std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::end(&this->m_ibos);
  while (bVar1 = __gnu_cxx::
                 operator==<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                           (&__end1,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                     *)&ibo), ((bVar1 ^ 0xffU) & 1) != 0) {
    v = __gnu_cxx::
        __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
        ::operator*(&__end1);
    read<unsigned_int>(v,local_220);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end1);
  }
  read((int)&count,local_220,__nbytes_05);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &count,"[NamedTextureImages]");
  if (!bVar1) {
    __assert_fail("(magic == \"[NamedTextureImages]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x133,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<unsigned_long>((unsigned_long *)&__range1,local_220);
  __nbytes_06 = extraout_RDX;
  while (pvVar5 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)((long)&__range1[-1].
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
        __range1 !=
        (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         *)0x0) {
    __range1 = pvVar5;
    read((int)&count,local_220,__nbytes_06);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &count,"_Image_");
    if (!bVar1) {
      __assert_fail("(magic == \"_Image_\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                    ,0x138,"void ObjLoader::loadBinaryFile(const std::string &)");
    }
    std::__cxx11::string::string((string *)&image.data);
    read((int)&image.data,local_220,__nbytes_07);
    Image<unsigned_char>::Image((Image<unsigned_char> *)local_3b8);
    read<int>((int *)((long)&dataSize + 4),local_220);
    local_3b8 = (undefined1  [4])dataSize._4_4_;
    read<int>((int *)((long)&dataSize + 4),local_220);
    value = dataSize._4_4_;
    read<int>((int *)((long)&dataSize + 4),local_220);
    image.width = dataSize._4_4_;
    read<int>((int *)((long)&dataSize + 4),local_220);
    image.height = dataSize._4_4_;
    image._8_8_ = operator_new__((long)((int)local_3b8 * value * image.width * dataSize._4_4_));
    std::istream::read((char *)local_220,image._8_8_);
    NamedTextureImages::add(&this->m_images,(string *)&image.data,(Image<unsigned_char> *)local_3b8)
    ;
    std::__cxx11::string::~string((string *)&image.data);
    __nbytes_06 = extraout_RDX_00;
  }
  __range1 = pvVar5;
  read((int)&count,local_220,__nbytes_06);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &count,"[SimpleMaterials]");
  if (!bVar1) {
    __assert_fail("(magic == \"[SimpleMaterials]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x14c,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<unsigned_long>((unsigned_long *)&__range1,local_220);
  std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::resize
            (&this->m_materials,(size_type)__range1);
  __end1_1 = std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::begin(&this->m_materials)
  ;
  material = (SimpleMaterial *)
             std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::end(&this->m_materials);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<SimpleMaterial_*,_std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>_>
                      (&__end1_1,
                       (__normal_iterator<SimpleMaterial_*,_std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>_>
                        *)&material);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::~string((string *)&count);
      std::ifstream::~ifstream(local_220);
      return;
    }
    pSVar4 = __gnu_cxx::
             __normal_iterator<SimpleMaterial_*,_std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>_>
             ::operator*(&__end1_1);
    read((int)&count,local_220,__nbytes_08);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &count,"_Material_");
    if (!bVar1) break;
    iVar2 = (int)pSVar4;
    read(iVar2,local_220,__nbytes_09);
    read<glm::vec<3,float,(glm::qualifier)0>>(&pSVar4->ambient,local_220);
    read<glm::vec<3,float,(glm::qualifier)0>>(&pSVar4->diffuse,local_220);
    read<glm::vec<3,float,(glm::qualifier)0>>(&pSVar4->specular,local_220);
    read<float>(&pSVar4->shininess,local_220);
    read(iVar2 + 0x48,local_220,__nbytes_10);
    read(iVar2 + 0x68,local_220,__nbytes_11);
    read(iVar2 + 0x88,local_220,__nbytes_12);
    __gnu_cxx::
    __normal_iterator<SimpleMaterial_*,_std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>_>
    ::operator++(&__end1_1);
  }
  __assert_fail("(magic == \"_Material_\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                ,0x152,"void ObjLoader::loadBinaryFile(const std::string &)");
}

Assistant:

void ObjLoader::loadBinaryFile(const std::string & filename)
{
  std::ifstream file(filename.c_str());
  char magicBuffer[255];
  memset(magicBuffer, 0, 255);
  file.read(magicBuffer, strlen(GLITTER_BINFILE_MAGIC));
  assert(!strcmp(magicBuffer, GLITTER_BINFILE_MAGIC) && "ObjLoader::loadBinaryFile(): Wrong file magic number");

  std::string magic;

  read(magic, file);
  assert((magic == "[VertexPositions]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexPositions, file);

  read(magic, file);
  assert((magic == "[VertexColors]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexColors, file);

  read(magic, file);
  assert((magic == "[VertexUVs]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexUVs, file);

  read(magic, file);
  assert((magic == "[VertexNormals]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexNormals, file);

  read(magic, file);
  assert((magic == "[VertexTangents]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexTangents, file);

  read(magic, file);
  assert((magic == "[IBOS]") && "ObjLoader::loadBinaryFile(): Tag not found");
  // IBOs
  std::uint64_t count;
  read(count, file);
  m_ibos.resize(count);
  for (IBO & ibo : m_ibos) {
    read(ibo, file);
  }

  read(magic, file);
  assert((magic == "[NamedTextureImages]") && "ObjLoader::loadBinaryFile(): Tag not found");
  // NamedTextureImages m_images;
  read(count, file);
  while (count--) {
    read(magic, file);
    assert((magic == "_Image_") && "ObjLoader::loadBinaryFile(): Tag not found");
    std::string name;
    read(name, file);
    Image<> image;
    glm::int32 value;
    read(value, file);
    image.width = value;
    read(value, file);
    image.height = value;
    read(value, file);
    image.depth = value;
    read(value, file);
    image.channels = value;
    size_t dataSize = image.width * image.height * image.depth * image.channels;
    image.data = new Image<>::value_type[dataSize];
    file.read(reinterpret_cast<char *>(image.data), dataSize * sizeof(Image<>::value_type));
    m_images.add(name, image);
  }

  read(magic, file);
  assert((magic == "[SimpleMaterials]") && "ObjLoader::loadBinaryFile(): Tag not found");
  // std::vector<SimpleMaterial> m_materials;
  read(count, file);
  m_materials.resize(count);
  for (SimpleMaterial & material : m_materials) {
    read(magic, file);
    assert((magic == "_Material_") && "ObjLoader::loadBinaryFile(): Tag not found");
    read(material.name, file);
    read(material.ambient, file);
    read(material.diffuse, file);
    read(material.specular, file);
    read(material.shininess, file);
    read(material.diffuseTexName, file);
    read(material.normalTexName, file);
    read(material.specularTexName, file);
  }
}